

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidRank(void)

{
  RepeatedField<long> *this;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  ModelDescription *pMVar4;
  Type *pTVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *pAVar7;
  TypeUnion this_00;
  Type *this_01;
  Type *pTVar8;
  SoftmaxLayerParams *this_02;
  ostream *poVar9;
  Rep *pRVar10;
  int iVar11;
  int iVar12;
  Result res;
  Model m1;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Model local_50;
  
  CoreML::Specification::Model::Model(&local_50);
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_50.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_78 + 0x10;
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar7 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  this = &pAVar7->shape_;
  iVar12 = (pAVar7->shape_).current_size_;
  iVar11 = (pAVar7->shape_).total_size_;
  if (iVar12 == iVar11) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar12 + 1);
    iVar12 = (pAVar7->shape_).current_size_;
    iVar11 = (pAVar7->shape_).total_size_;
  }
  pRVar10 = (pAVar7->shape_).rep_;
  iVar3 = iVar12 + 1;
  (pAVar7->shape_).current_size_ = iVar3;
  pRVar10->elements[iVar12] = 5;
  if (iVar3 == iVar11) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar12 + 2);
    iVar3 = (pAVar7->shape_).current_size_;
    iVar11 = (pAVar7->shape_).total_size_;
    pRVar10 = (pAVar7->shape_).rep_;
  }
  iVar12 = iVar3 + 1;
  this->current_size_ = iVar12;
  pRVar10->elements[iVar3] = 5;
  if (iVar12 == iVar11) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar3 + 2);
    iVar12 = (pAVar7->shape_).current_size_;
    pRVar10 = (pAVar7->shape_).rep_;
  }
  this->current_size_ = iVar12 + 1;
  pRVar10->elements[iVar12] = 5;
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_50.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"probs","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  if (local_50._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_50);
    local_50._oneof_case_[0] = 500;
    this_00.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this_00.neuralnetwork_);
    local_50.Type_.pipelineclassifier_ = this_00.pipelineclassifier_;
  }
  (local_50.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_50.Type_.pipeline_)->models_,(Type *)0x0);
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"softmax","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_01->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"probs");
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                     (&(this_01->inputtensor_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pTVar8->rank_ = 2;
  if (this_01->_oneof_case_[0] != 0xaf) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_01);
    this_01->_oneof_case_[0] = 0xaf;
    this_02 = (SoftmaxLayerParams *)operator_new(0x18);
    CoreML::Specification::SoftmaxLayerParams::SoftmaxLayerParams(this_02);
    (this_01->layer_).softmax_ = this_02;
  }
  CoreML::validate<(MLModelType)500>((Result *)local_78,&local_50);
  bVar2 = CoreML::Result::good((Result *)local_78);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xd53);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._8_8_ != &local_60) {
    operator_delete((void *)local_78._8_8_,local_60._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_50);
  return (uint)bVar2;
}

Assistant:

int testInvalidRank() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(5);
    shape->add_shape(5);
    shape->add_shape(5);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *layer = nn->add_layers();
    layer->set_name("softmax");
    layer->add_input("input");
    layer->add_output("probs");
    layer->add_inputtensor()->set_rank(2); // this is incorrect, rank must be 3 since shape is (5,5,5)
    (void) layer->mutable_softmax();

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;
}